

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

int BackwardReferencesLz77
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs)

{
  int in_ECX;
  int in_ESI;
  int in_EDI;
  VP8LBackwardRefs *in_R9;
  int reach;
  int len_j;
  int j_max;
  int max_reach;
  int len_ini;
  int j;
  int len;
  int offset;
  VP8LColorCache hashers;
  int pix_count;
  int use_color_cache;
  int cc_init;
  int ok;
  int i_last_check;
  int i;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa4;
  int local_38;
  uint local_34;
  int local_2c;
  
  local_34 = 0;
  local_38 = 0;
  if ((in_ECX < 1) ||
     (local_38 = VP8LColorCacheInit((VP8LColorCache *)
                                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0)
     , local_38 != 0)) {
    VP8LClearBackwardRefs(in_R9);
    for (local_2c = 0; local_2c < in_EDI * in_ESI; local_2c = local_2c + 1) {
      VP8LHashChainFindCopy
                ((VP8LHashChain *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                 (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      AddSingleLiteral(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                       (VP8LColorCache *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (VP8LBackwardRefs *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    local_34 = (uint)((in_R9->error != 0 ^ 0xffU) & 1);
  }
  if (local_38 != 0) {
    VP8LColorCacheClear((VP8LColorCache *)0x18f8df);
  }
  return local_34;
}

Assistant:

static int BackwardReferencesLz77(int xsize, int ysize,
                                  const uint32_t* const argb, int cache_bits,
                                  const VP8LHashChain* const hash_chain,
                                  VP8LBackwardRefs* const refs) {
  int i;
  int i_last_check = -1;
  int ok = 0;
  int cc_init = 0;
  const int use_color_cache = (cache_bits > 0);
  const int pix_count = xsize * ysize;
  VP8LColorCache hashers;

  if (use_color_cache) {
    cc_init = VP8LColorCacheInit(&hashers, cache_bits);
    if (!cc_init) goto Error;
  }
  VP8LClearBackwardRefs(refs);
  for (i = 0; i < pix_count;) {
    // Alternative#1: Code the pixels starting at 'i' using backward reference.
    int offset = 0;
    int len = 0;
    int j;
    VP8LHashChainFindCopy(hash_chain, i, &offset, &len);
    if (len >= MIN_LENGTH) {
      const int len_ini = len;
      int max_reach = 0;
      const int j_max =
          (i + len_ini >= pix_count) ? pix_count - 1 : i + len_ini;
      // Only start from what we have not checked already.
      i_last_check = (i > i_last_check) ? i : i_last_check;
      // We know the best match for the current pixel but we try to find the
      // best matches for the current pixel AND the next one combined.
      // The naive method would use the intervals:
      // [i,i+len) + [i+len, length of best match at i+len)
      // while we check if we can use:
      // [i,j) (where j<=i+len) + [j, length of best match at j)
      for (j = i_last_check + 1; j <= j_max; ++j) {
        const int len_j = VP8LHashChainFindLength(hash_chain, j);
        const int reach =
            j + (len_j >= MIN_LENGTH ? len_j : 1);  // 1 for single literal.
        if (reach > max_reach) {
          len = j - i;
          max_reach = reach;
          if (max_reach >= pix_count) break;
        }
      }
    } else {
      len = 1;
    }
    // Go with literal or backward reference.
    assert(len > 0);
    if (len == 1) {
      AddSingleLiteral(argb[i], use_color_cache, &hashers, refs);
    } else {
      VP8LBackwardRefsCursorAdd(refs, PixOrCopyCreateCopy(offset, len));
      if (use_color_cache) {
        for (j = i; j < i + len; ++j) VP8LColorCacheInsert(&hashers, argb[j]);
      }
    }
    i += len;
  }

  ok = !refs->error;
 Error:
  if (cc_init) VP8LColorCacheClear(&hashers);
  return ok;
}